

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_interpolator_tests.cpp
# Opt level: O1

void apply_constant<ear::dsp::LinearInterpSingle,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>,float>
               (VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *in,
               VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1> *out,float *point)

{
  long lVar1;
  long lVar2;
  long lVar3;
  value_type *__val;
  long lVar4;
  PtrAdapter out_p;
  PtrAdapter in_p;
  long *local_68;
  long *plStack_60;
  long *local_58;
  long *local_48;
  long *plStack_40;
  long *local_38;
  
  local_48 = (long *)0x0;
  plStack_40 = (long *)0x0;
  local_38 = (long *)0x0;
  local_48 = (long *)operator_new(8);
  plStack_40 = local_48 + 1;
  *local_48 = 0;
  local_38 = plStack_40;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&local_48,in,0);
  local_68 = (long *)0x0;
  plStack_60 = (long *)0x0;
  local_58 = (long *)0x0;
  local_68 = (long *)operator_new(8);
  plStack_60 = local_68 + 1;
  *local_68 = 0;
  local_58 = plStack_60;
  ear::dsp::PtrAdapterT<float*>::set_eigen<Eigen::VectorBlock<Eigen::Matrix<float,_1,1,0,_1,1>,_1>&>
            ((PtrAdapterT<float*> *)&local_68,out,0);
  lVar1 = (in->super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>).
          super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows
          .m_value;
  if (0 < lVar1) {
    lVar2 = *local_48;
    lVar3 = *local_68;
    lVar4 = 0;
    do {
      *(float *)(lVar3 + lVar4 * 4) = *(float *)(lVar2 + lVar4 * 4) * *point;
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  if (local_68 != (long *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void apply_constant(In &&in, Out &&out, const Point &point) {
  PtrAdapter in_p(in.cols());
  in_p.set_eigen(in);
  PtrAdapter out_p(out.cols());
  out_p.set_eigen(out);

  Interp::apply_constant(in_p.ptrs(), out_p.ptrs(), 0, (SampleIndex)in.rows(),
                         point);
}